

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_jsr(ExecutionEngine *this)

{
  byte bVar1;
  byte bVar2;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar3;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar3 = Frame::getCode(this_01,this_01->pc);
  bVar1 = puVar3[2];
  bVar2 = puVar3[1];
  operand.data._0_4_ = this_01->pc + 3;
  operand.printType = BOOLEAN;
  operand.type = RETURN_ADDR;
  operand.data.longValue._4_4_ = 0;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + ((int)(short)((ushort)bVar2 << 8) | (uint)bVar1);
  return;
}

Assistant:

void ExecutionEngine::i_jsr() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();
	
	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1];
	u1 byte2 = code[2];
	int16_t branchOffset = (byte1 << 8) | byte2;
	
	Value returnAddr;
	returnAddr.type = ValueType::RETURN_ADDR;
	returnAddr.data.returnAddress = topFrame->pc + 3; 
	topFrame->pushIntoOperandStack(returnAddr);
	
	topFrame->pc += branchOffset;
}